

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBaseGL.hpp
# Opt level: O1

void __thiscall
Diligent::TextureBaseGL::UpdateData
          (TextureBaseGL *this,GLContextState *CtxState,Uint32 MipLevel,Uint32 Slice,Box *DstBox,
          TextureSubResData *SubresData)

{
  GLContextState::EnsureMemoryBarrier
            (CtxState,MEMORY_BARRIER_TEXTURE_UPDATE,&this->super_AsyncWritableResource);
  return;
}

Assistant:

void TextureBaseGL::TextureMemoryBarrier(MEMORY_BARRIER RequiredBarriers, GLContextState& GLContextState)
{
#if GL_ARB_shader_image_load_store
#    ifdef DILIGENT_DEBUG
    {
        constexpr Uint32 TextureBarriers = MEMORY_BARRIER_ALL_TEXTURE_BARRIERS;
        VERIFY((RequiredBarriers & TextureBarriers) != 0, "At least one texture memory barrier flag should be set");
        VERIFY((RequiredBarriers & ~TextureBarriers) == 0, "Inappropriate texture memory barrier flag");
    }
#    endif

    GLContextState.EnsureMemoryBarrier(RequiredBarriers, this);
#endif
}